

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
slice_projection::evaluate
          (slice_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  long lVar1;
  pointer ppeVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  undefined4 extraout_var;
  reference pbVar7;
  undefined4 extraout_var_00;
  size_t sVar8;
  pointer ptr;
  size_t sVar9;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar10;
  int64_t i;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_50;
  long local_48;
  slice_projection *local_40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_38;
  
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(val);
  if (bVar3) {
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    if ((this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      sVar9 = (lVar1 >> 0x3f & sVar5) + lVar1;
      if ((long)sVar5 <= (long)sVar9) {
        sVar9 = sVar5;
      }
    }
    else {
      sVar9 = (this->slice_).step_ >> 0x3f & sVar5;
    }
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    if ((this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      sVar8 = (lVar1 >> 0x3f & sVar5) + lVar1;
      if ((long)sVar5 <= (long)sVar8) {
        sVar8 = sVar5;
      }
    }
    else {
      sVar8 = 0xffffffffffffffff;
      if (-1 < (this->slice_).step_) {
        sVar8 = sVar5;
      }
    }
    lVar1 = (this->slice_).step_;
    if (lVar1 != 0) {
      this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                            *)context,(json_array_arg_t *)&json_array_arg);
      local_48 = lVar1;
      local_40 = this;
      local_38 = val;
      if (lVar1 < 1) {
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar5 <= (long)sVar9) {
          sVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
          sVar9 = sVar9 - 1;
        }
        sVar5 = 0xffffffffffffffff;
        if (-1 < (long)sVar8) {
          sVar5 = sVar8;
        }
        for (; (long)sVar5 < (long)sVar9; sVar9 = sVar9 + local_48) {
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(val,sVar9);
          ppeVar2 = (local_40->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppeVar10 = (local_40->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppeVar10 != ppeVar2;
              ppeVar10 = ppeVar10 + 1) {
            iVar4 = (*((*ppeVar10)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar10,pbVar6,context,ec);
            pbVar6 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar4);
          }
          bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(pbVar6);
          if (!bVar3) {
            local_50 = pbVar6;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_50);
          }
          val = local_38;
        }
      }
      else {
        sVar5 = 0;
        if (0 < (long)sVar9) {
          sVar5 = sVar9;
        }
        sVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar9 < (long)sVar8) {
          sVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        }
        for (; (long)sVar5 < (long)sVar8; sVar5 = sVar5 + local_48) {
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(val,sVar5);
          ppeVar2 = (local_40->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppeVar10 = (local_40->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppeVar10 != ppeVar2;
              ppeVar10 = ppeVar10 + 1) {
            iVar4 = (*((*ppeVar10)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar10,pbVar6,context,ec);
            pbVar6 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar4);
          }
          bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(pbVar6);
          if (!bVar3) {
            local_50 = pbVar6;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_50);
          }
          val = local_38;
        }
      }
      return (reference)this_00;
    }
    std::error_code::operator=(ec,step_cannot_be_zero);
  }
  pbVar7 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar7;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto start = slice_.get_start(val.size());
                auto end = slice_.get_stop(val.size());
                auto step = slice_.step();

                if (step == 0)
                {
                    ec = jmespath_errc::step_cannot_be_zero;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(val.size()))
                    {
                        end = val.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                else
                {
                    if (start >= static_cast<int64_t>(val.size()))
                    {
                        start = static_cast<int64_t>(val.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }

                return *result;
            }